

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddExecutableCommand.cxx
# Opt level: O1

bool __thiscall
cmAddExecutableCommand::InitialPass
          (cmAddExecutableCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pcVar1;
  bool excludeFromAll;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  undefined8 uVar6;
  long lVar7;
  ostream *poVar8;
  cmTarget *pcVar9;
  pointer pbVar10;
  pointer pbVar11;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  srclists;
  ostringstream e;
  string local_1e8;
  uint local_1c4;
  uint local_1c0;
  uint local_1bc;
  undefined1 local_1b8 [112];
  ios_base local_148 [264];
  pointer local_40;
  cmCommand *local_38;
  
  pbVar10 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (pbVar10 ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    local_1b8._0_8_ = local_1b8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b8,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_1b8);
  }
  else {
    __first._M_current = pbVar10 + 1;
    if (__first._M_current ==
        (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      bVar4 = false;
      local_1c4 = 0;
      local_1c0 = 0;
      excludeFromAll = false;
      bVar3 = false;
      local_1bc = 0;
      pbVar11 = pbVar10;
    }
    else {
      local_1bc = 0;
      bVar3 = false;
      excludeFromAll = false;
      local_1c0 = 0;
      local_1c4 = 0;
      bVar4 = false;
      pbVar11 = pbVar10;
      local_40 = pbVar10;
      local_38 = &this->super_cmCommand;
      do {
        pbVar10 = pbVar11;
        __first._M_current = pbVar10 + 1;
        uVar6 = std::__cxx11::string::compare((char *)__first._M_current);
        if ((int)uVar6 == 0) {
          local_1bc = (uint)CONCAT71((int7)((ulong)uVar6 >> 8),1);
        }
        else {
          iVar5 = std::__cxx11::string::compare((char *)__first._M_current);
          if (iVar5 == 0) {
            bVar3 = true;
          }
          else {
            iVar5 = std::__cxx11::string::compare((char *)__first._M_current);
            if (iVar5 == 0) {
              excludeFromAll = true;
            }
            else {
              iVar5 = std::__cxx11::string::compare((char *)__first._M_current);
              if (iVar5 == 0) {
                bVar4 = true;
              }
              else if ((bVar4) &&
                      (uVar6 = std::__cxx11::string::compare((char *)__first._M_current),
                      (int)uVar6 == 0)) {
                local_1c4 = (uint)CONCAT71((int7)((ulong)uVar6 >> 8),1);
              }
              else {
                uVar6 = std::__cxx11::string::compare((char *)__first._M_current);
                this = (cmAddExecutableCommand *)local_38;
                pbVar11 = local_40;
                if ((int)uVar6 != 0) goto LAB_0022a79c;
                local_1c0 = (uint)CONCAT71((int7)((ulong)uVar6 >> 8),1);
              }
            }
          }
        }
        pbVar11 = pbVar10 + 1;
      } while (pbVar10 + 2 !=
               (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish);
      __first._M_current = pbVar10 + 2;
      pbVar10 = pbVar10 + 1;
      this = (cmAddExecutableCommand *)local_38;
      pbVar11 = local_40;
    }
LAB_0022a79c:
    bVar2 = cmGeneratorExpression::IsValidTargetName(pbVar11);
    if (bVar2) {
      bVar2 = cmGlobalGenerator::IsReservedTarget(pbVar11);
      bVar2 = !bVar2;
    }
    else {
      bVar2 = false;
    }
    if (((bVar4 | (byte)local_1c0 | ~bVar2) & 1) == 0) {
      lVar7 = std::__cxx11::string::find((char)pbVar11,0x3a);
      bVar2 = lVar7 == -1;
    }
    if ((bVar2 == false) &&
       (bVar2 = cmMakefile::CheckCMP0037((this->super_cmCommand).Makefile,pbVar11,EXECUTABLE),
       !bVar2)) {
      return false;
    }
    if (bVar4 == false) {
LAB_0022a8bb:
      if ((local_1c0 & 1) == 0) {
        if (bVar4 == false) {
          pcVar1 = local_1b8 + 0x10;
          local_1b8._8_8_ = 0;
          local_1b8[0x10] = '\0';
          local_1b8._0_8_ = pcVar1;
          bVar4 = cmMakefile::EnforceUniqueName
                            ((this->super_cmCommand).Makefile,pbVar11,(string *)local_1b8,false);
          if (bVar4) {
            if ((pointer)local_1b8._0_8_ != pcVar1) {
              operator_delete((void *)local_1b8._0_8_,CONCAT71(local_1b8._17_7_,local_1b8[0x10]) + 1
                             );
            }
          }
          else {
            cmCommand::SetError(&this->super_cmCommand,(string *)local_1b8);
            if ((pointer)local_1b8._0_8_ != pcVar1) {
              operator_delete((void *)local_1b8._0_8_,CONCAT71(local_1b8._17_7_,local_1b8[0x10]) + 1
                             );
            }
            if (!bVar4) {
              return false;
            }
          }
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          vector<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1e8
                     ,__first,(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish,
                     (allocator_type *)local_1b8);
          pcVar9 = cmMakefile::AddExecutable
                             ((this->super_cmCommand).Makefile,pbVar11,
                              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&local_1e8,excludeFromAll);
          if ((local_1bc & 1) != 0) {
            local_1b8._0_8_ = pcVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1b8,"WIN32_EXECUTABLE","");
            cmTarget::SetProperty(pcVar9,(string *)local_1b8,"ON");
            if ((pointer)local_1b8._0_8_ != pcVar1) {
              operator_delete((void *)local_1b8._0_8_,CONCAT71(local_1b8._17_7_,local_1b8[0x10]) + 1
                             );
            }
          }
          if (bVar3) {
            local_1b8._0_8_ = pcVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"MACOSX_BUNDLE","");
            cmTarget::SetProperty(pcVar9,(string *)local_1b8,"ON");
            if ((pointer)local_1b8._0_8_ != pcVar1) {
              operator_delete((void *)local_1b8._0_8_,CONCAT71(local_1b8._17_7_,local_1b8[0x10]) + 1
                             );
            }
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_1e8);
          return true;
        }
        pcVar9 = cmMakefile::FindTargetToUse((this->super_cmCommand).Makefile,pbVar11,false);
        if (pcVar9 == (cmTarget *)0x0) {
          cmMakefile::AddImportedTarget
                    ((this->super_cmCommand).Makefile,pbVar11,EXECUTABLE,(bool)((byte)local_1c4 & 1)
                    );
          return true;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1b8,"cannot create imported target \"",0x1f);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1b8,(pbVar11->_M_dataplus)._M_p,
                            pbVar11->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,"\" because another target with the same name already exists.",0x3b);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&local_1e8);
LAB_0022a994:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
        std::ios_base::~ios_base(local_148);
        return false;
      }
      bVar3 = cmGeneratorExpression::IsValidTargetName(pbVar11);
      if (!bVar3) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1b8,"Invalid name for ALIAS: ",pbVar11);
        cmCommand::SetError(&this->super_cmCommand,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_1b8);
        if ((undefined1 *)local_1b8._0_8_ == local_1b8 + 0x10) {
          return false;
        }
        goto LAB_0022aab0;
      }
      if (excludeFromAll == false) {
        if (bVar4 == false && (local_1c4 & 1) == 0) {
          if ((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start == 0x60) {
            bVar4 = cmMakefile::IsAlias((this->super_cmCommand).Makefile,__first._M_current);
            if (bVar4) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1b8,"cannot create ALIAS target \"",0x1c);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_1b8,(pbVar11->_M_dataplus)._M_p,
                                  pbVar11->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\" because target \"",0x12)
              ;
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar8,((__first._M_current)->_M_dataplus)._M_p,
                                  pbVar10[1]._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar8,"\" is itself an ALIAS.",0x15);
              std::__cxx11::stringbuf::str();
              cmCommand::SetError(&this->super_cmCommand,&local_1e8);
            }
            else {
              pcVar9 = cmMakefile::FindTargetToUse
                                 ((this->super_cmCommand).Makefile,__first._M_current,true);
              if (pcVar9 == (cmTarget *)0x0) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1b8,"cannot create ALIAS target \"",0x1c);
                poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_1b8,(pbVar11->_M_dataplus)._M_p,
                                    pbVar11->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar8,"\" because target \"",0x12);
                poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar8,((__first._M_current)->_M_dataplus)._M_p,
                                    pbVar10[1]._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar8,"\" does not already exist.",0x19);
                std::__cxx11::stringbuf::str();
                cmCommand::SetError(&this->super_cmCommand,&local_1e8);
              }
              else if (pcVar9->TargetTypeValue == EXECUTABLE) {
                if ((pcVar9->IsImportedTarget != true) || (pcVar9->ImportedGloballyVisible != false)
                   ) {
                  cmMakefile::AddAlias((this->super_cmCommand).Makefile,pbVar11,__first._M_current);
                  return true;
                }
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1b8,"cannot create ALIAS target \"",0x1c);
                poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_1b8,(pbVar11->_M_dataplus)._M_p,
                                    pbVar11->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar8,"\" because target \"",0x12);
                poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar8,((__first._M_current)->_M_dataplus)._M_p,
                                    pbVar10[1]._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar8,"\" is imported but not globally visible.",0x27);
                std::__cxx11::stringbuf::str();
                cmCommand::SetError(&this->super_cmCommand,&local_1e8);
              }
              else {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1b8,"cannot create ALIAS target \"",0x1c);
                poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_1b8,(pbVar11->_M_dataplus)._M_p,
                                    pbVar11->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar8,"\" because target \"",0x12);
                poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar8,((__first._M_current)->_M_dataplus)._M_p,
                                    pbVar10[1]._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar8,"\" is not an executable.",0x17);
                std::__cxx11::stringbuf::str();
                cmCommand::SetError(&this->super_cmCommand,&local_1e8);
              }
            }
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1b8,"ALIAS requires exactly one target argument.",0x2b);
            std::__cxx11::stringbuf::str();
            cmCommand::SetError(&this->super_cmCommand,&local_1e8);
          }
          goto LAB_0022a994;
        }
        local_1b8._0_8_ = local_1b8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1b8,"IMPORTED with ALIAS is not allowed.","");
        cmCommand::SetError(&this->super_cmCommand,(string *)local_1b8);
      }
      else {
        local_1b8._0_8_ = local_1b8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1b8,"EXCLUDE_FROM_ALL with ALIAS makes no sense.","");
        cmCommand::SetError(&this->super_cmCommand,(string *)local_1b8);
      }
    }
    else if ((local_1bc & 1) == 0) {
      if (!bVar3) {
        if (!excludeFromAll) goto LAB_0022a8bb;
        if (!bVar3) {
          local_1b8._0_8_ = local_1b8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1b8,"may not be given EXCLUDE_FROM_ALL for an IMPORTED target."
                     ,"");
          cmCommand::SetError(&this->super_cmCommand,(string *)local_1b8);
          goto LAB_0022aaa6;
        }
      }
      local_1b8._0_8_ = local_1b8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b8,"may not be given MACOSX_BUNDLE for an IMPORTED target.","");
      cmCommand::SetError(&this->super_cmCommand,(string *)local_1b8);
    }
    else {
      local_1b8._0_8_ = local_1b8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b8,"may not be given WIN32 for an IMPORTED target.","");
      cmCommand::SetError(&this->super_cmCommand,(string *)local_1b8);
    }
  }
LAB_0022aaa6:
  if ((undefined1 *)local_1b8._0_8_ == local_1b8 + 0x10) {
    return false;
  }
LAB_0022aab0:
  operator_delete((void *)local_1b8._0_8_,CONCAT71(local_1b8._17_7_,local_1b8[0x10]) + 1);
  return false;
}

Assistant:

bool cmAddExecutableCommand::InitialPass(std::vector<std::string> const& args,
                                         cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  std::vector<std::string>::const_iterator s = args.begin();

  std::string const& exename = *s;

  ++s;
  bool use_win32 = false;
  bool use_macbundle = false;
  bool excludeFromAll = false;
  bool importTarget = false;
  bool importGlobal = false;
  bool isAlias = false;
  while (s != args.end()) {
    if (*s == "WIN32") {
      ++s;
      use_win32 = true;
    } else if (*s == "MACOSX_BUNDLE") {
      ++s;
      use_macbundle = true;
    } else if (*s == "EXCLUDE_FROM_ALL") {
      ++s;
      excludeFromAll = true;
    } else if (*s == "IMPORTED") {
      ++s;
      importTarget = true;
    } else if (importTarget && *s == "GLOBAL") {
      ++s;
      importGlobal = true;
    } else if (*s == "ALIAS") {
      ++s;
      isAlias = true;
    } else {
      break;
    }
  }

  bool nameOk = cmGeneratorExpression::IsValidTargetName(exename) &&
    !cmGlobalGenerator::IsReservedTarget(exename);

  if (nameOk && !importTarget && !isAlias) {
    nameOk = exename.find(':') == std::string::npos;
  }
  if (!nameOk &&
      !this->Makefile->CheckCMP0037(exename, cmStateEnums::EXECUTABLE)) {
    return false;
  }

  // Special modifiers are not allowed with IMPORTED signature.
  if (importTarget && (use_win32 || use_macbundle || excludeFromAll)) {
    if (use_win32) {
      this->SetError("may not be given WIN32 for an IMPORTED target.");
    } else if (use_macbundle) {
      this->SetError("may not be given MACOSX_BUNDLE for an IMPORTED target.");
    } else // if(excludeFromAll)
    {
      this->SetError(
        "may not be given EXCLUDE_FROM_ALL for an IMPORTED target.");
    }
    return false;
  }
  if (isAlias) {
    if (!cmGeneratorExpression::IsValidTargetName(exename)) {
      this->SetError("Invalid name for ALIAS: " + exename);
      return false;
    }
    if (excludeFromAll) {
      this->SetError("EXCLUDE_FROM_ALL with ALIAS makes no sense.");
      return false;
    }
    if (importTarget || importGlobal) {
      this->SetError("IMPORTED with ALIAS is not allowed.");
      return false;
    }
    if (args.size() != 3) {
      std::ostringstream e;
      e << "ALIAS requires exactly one target argument.";
      this->SetError(e.str());
      return false;
    }

    std::string const& aliasedName = *s;
    if (this->Makefile->IsAlias(aliasedName)) {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << exename << "\" because target \""
        << aliasedName << "\" is itself an ALIAS.";
      this->SetError(e.str());
      return false;
    }
    cmTarget* aliasedTarget =
      this->Makefile->FindTargetToUse(aliasedName, true);
    if (!aliasedTarget) {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << exename << "\" because target \""
        << aliasedName << "\" does not already exist.";
      this->SetError(e.str());
      return false;
    }
    cmStateEnums::TargetType type = aliasedTarget->GetType();
    if (type != cmStateEnums::EXECUTABLE) {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << exename << "\" because target \""
        << aliasedName << "\" is not an executable.";
      this->SetError(e.str());
      return false;
    }
    if (aliasedTarget->IsImported() &&
        !aliasedTarget->IsImportedGloballyVisible()) {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << exename << "\" because target \""
        << aliasedName << "\" is imported but not globally visible.";
      this->SetError(e.str());
      return false;
    }
    this->Makefile->AddAlias(exename, aliasedName);
    return true;
  }

  // Handle imported target creation.
  if (importTarget) {
    // Make sure the target does not already exist.
    if (this->Makefile->FindTargetToUse(exename)) {
      std::ostringstream e;
      e << "cannot create imported target \"" << exename
        << "\" because another target with the same name already exists.";
      this->SetError(e.str());
      return false;
    }

    // Create the imported target.
    this->Makefile->AddImportedTarget(exename, cmStateEnums::EXECUTABLE,
                                      importGlobal);
    return true;
  }

  // Enforce name uniqueness.
  {
    std::string msg;
    if (!this->Makefile->EnforceUniqueName(exename, msg)) {
      this->SetError(msg);
      return false;
    }
  }

  std::vector<std::string> srclists(s, args.end());
  cmTarget* tgt =
    this->Makefile->AddExecutable(exename, srclists, excludeFromAll);
  if (use_win32) {
    tgt->SetProperty("WIN32_EXECUTABLE", "ON");
  }
  if (use_macbundle) {
    tgt->SetProperty("MACOSX_BUNDLE", "ON");
  }

  return true;
}